

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildRender32bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uint in_marker_pixel_value)

{
  uint *puVar1;
  int off_x;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  puVar1 = atlas->TexPixelsRGBA32 + (long)x + (long)y * (long)atlas->TexWidth;
  uVar5 = 0;
  if (0 < w) {
    uVar5 = (ulong)(uint)w;
  }
  iVar4 = 0;
  if (h < 1) {
    h = 0;
    iVar4 = 0;
  }
  for (; iVar4 != h; iVar4 = iVar4 + 1) {
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = 0;
      if (in_str[uVar2] == in_marker_char) {
        uVar3 = in_marker_pixel_value;
      }
      puVar1[uVar2] = uVar3;
    }
    puVar1 = puVar1 + atlas->TexWidth;
    in_str = in_str + w;
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned int in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned int* out_pixel = atlas->TexPixelsRGBA32 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : IM_COL32_BLACK_TRANS;
}